

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.hpp
# Opt level: O2

void __thiscall ot::commissioner::JobManager::~JobManager(JobManager *this)

{
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->mDefaultCommissioner).
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->mImportFile);
  Config::~Config(&this->mDefaultConf);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ot::commissioner::CommissionerApp>_>_>_>
  ::~_Rb_tree(&(this->mCommissionerPool)._M_t);
  std::_Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>::
  ~_Vector_base((_Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_> *)
                this);
  return;
}

Assistant:

~JobManager() = default;